

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LoopPeeling::InsertCanonicalInductionVariable
          (LoopPeeling *this,LoopCloningResult *clone_results)

{
  iterator instr;
  uint32_t uVar1;
  uint32_t op1;
  uint32_t op2;
  DefUseManager *pDVar2;
  mapped_type *pmVar3;
  Instruction *pIVar4;
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  iterator insert_point;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_80;
  uint32_t local_7c;
  SmallVector<unsigned_int,_2UL> local_78;
  InstructionBuilder builder;
  
  if (this->original_loop_canonical_induction_variable_ == (Instruction *)0x0) {
    BasicBlock::tail((BasicBlock *)&insert_point);
    pIVar4 = BasicBlock::GetMergeInst(this->cloned_loop_->loop_latch_);
    if (pIVar4 != (Instruction *)0x0) {
      insert_point.super_iterator.node_ =
           *(iterator *)((long)insert_point.super_iterator.node_ + 0x10);
    }
    InstructionBuilder::InstructionBuilder
              (&builder,this->context_,(Instruction *)insert_point.super_iterator.node_,
               kAnalysisInstrToBlockMapping|kAnalysisBegin);
    pIVar4 = InstructionBuilder::GetIntConstant<unsigned_int>(&builder,1,this->int_type_->signed_);
    uVar1 = Instruction::type_id(pIVar4);
    op1 = Instruction::result_id(pIVar4);
    op2 = Instruction::result_id(pIVar4);
    this_00 = InstructionBuilder::AddIAdd(&builder,uVar1,op1,op2);
    instr.node_ = (this->cloned_loop_->loop_header_->insts_).
                  super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    builder.parent_ = IRContext::get_instr_block(builder.context_,instr.node_);
    builder.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
    uVar1 = Instruction::type_id(pIVar4);
    pIVar4 = InstructionBuilder::GetIntConstant<unsigned_int>(&builder,0,this->int_type_->signed_);
    local_88 = Instruction::result_id(pIVar4);
    local_84 = BasicBlock::id(this->cloned_loop_->loop_preheader_);
    local_80 = Instruction::result_id(this_00);
    local_7c = BasicBlock::id(this->cloned_loop_->loop_latch_);
    local_78._vptr_SmallVector = (_func_int **)0x0;
    local_78.size_ = 0;
    local_78.buffer[0].data._M_elems = (array<signed_char,_4UL>)0x0;
    local_78.buffer[1].data._M_elems = (array<signed_char,_4UL>)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,&local_88,&local_78);
    pIVar4 = InstructionBuilder::AddPhi
                       (&builder,uVar1,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,0);
    this->canonical_induction_variable_ = pIVar4;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
    local_88 = Instruction::result_id(this->canonical_induction_variable_);
    init_list._M_len = 1;
    init_list._M_array = &local_88;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_78,init_list);
    Instruction::SetInOperand(this_00,0,&local_78);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78);
    pDVar2 = IRContext::get_def_use_mgr(this->context_);
    analysis::DefUseManager::AnalyzeInstUse(pDVar2,this_00);
    if (this->do_while_form_ == true) {
      this->canonical_induction_variable_ = this_00;
    }
  }
  else {
    pDVar2 = IRContext::get_def_use_mgr(this->context_);
    uVar1 = Instruction::result_id(this->original_loop_canonical_induction_variable_);
    local_78._vptr_SmallVector = (_func_int **)CONCAT44(local_78._vptr_SmallVector._4_4_,uVar1);
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&clone_results->value_map_,(key_type *)&local_78);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar2,*pmVar3);
    this->canonical_induction_variable_ = pIVar4;
  }
  return;
}

Assistant:

void LoopPeeling::InsertCanonicalInductionVariable(
    LoopUtils::LoopCloningResult* clone_results) {
  if (original_loop_canonical_induction_variable_) {
    canonical_induction_variable_ =
        context_->get_def_use_mgr()->GetDef(clone_results->value_map_.at(
            original_loop_canonical_induction_variable_->result_id()));
    return;
  }

  BasicBlock::iterator insert_point = GetClonedLoop()->GetLatchBlock()->tail();
  if (GetClonedLoop()->GetLatchBlock()->GetMergeInst()) {
    --insert_point;
  }
  InstructionBuilder builder(
      context_, &*insert_point,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* uint_1_cst =
      builder.GetIntConstant<uint32_t>(1, int_type_->IsSigned());
  // Create the increment.
  // Note that we do "1 + 1" here, one of the operand should the phi
  // value but we don't have it yet. The operand will be set latter.
  Instruction* iv_inc = builder.AddIAdd(
      uint_1_cst->type_id(), uint_1_cst->result_id(), uint_1_cst->result_id());

  builder.SetInsertPoint(&*GetClonedLoop()->GetHeaderBlock()->begin());

  canonical_induction_variable_ = builder.AddPhi(
      uint_1_cst->type_id(),
      {builder.GetIntConstant<uint32_t>(0, int_type_->IsSigned())->result_id(),
       GetClonedLoop()->GetPreHeaderBlock()->id(), iv_inc->result_id(),
       GetClonedLoop()->GetLatchBlock()->id()});
  // Connect everything.
  iv_inc->SetInOperand(0, {canonical_induction_variable_->result_id()});

  // Update def/use manager.
  context_->get_def_use_mgr()->AnalyzeInstUse(iv_inc);

  // If do-while form, use the incremented value.
  if (do_while_form_) {
    canonical_induction_variable_ = iv_inc;
  }
}